

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomCustomWidget::read(DomCustomWidget *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomHeader *this_00;
  DomSize *this_01;
  DomSlots *this_02;
  DomPropertySpecifications *this_03;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_04;
  char *pcVar4;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringView other_04;
  QStringView other_05;
  QStringView other_06;
  QStringView other_07;
  QStringView other_08;
  QStringView other_09;
  QStringView other_10;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_80;
  QArrayDataPointer<char16_t> local_68;
  char *local_50;
  QStringView local_48;
  long local_38;
  
  this_04 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
LAB_001537ae:
  while( true ) {
    bVar1 = QXmlStreamReader::hasError(this_04);
    if (bVar1) goto LAB_00153d1b;
    iVar2 = QXmlStreamReader::readNext();
    if (iVar2 == 4) break;
    if (iVar2 == 5) {
LAB_00153d1b:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  local_48.m_size = -0x5555555555555556;
  local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  local_48 = (QStringView)QXmlStreamReader::name();
  Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"class",5);
  other.m_data._4_4_ = local_68.ptr._4_4_;
  other.m_data._0_4_ = local_68.ptr._0_4_;
  other.m_size._4_4_ = local_68.size._4_4_;
  other.m_size._0_4_ = (undefined4)local_68.size;
  iVar2 = QStringView::compare(&local_48,other,CaseInsensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (iVar2 == 0) {
    QXmlStreamReader::readElementText(&local_68,this_04,0);
    setElementClass(this,(QString *)&local_68);
  }
  else {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"extends",7);
    other_00.m_data._4_4_ = local_68.ptr._4_4_;
    other_00.m_data._0_4_ = local_68.ptr._0_4_;
    other_00.m_size._4_4_ = local_68.size._4_4_;
    other_00.m_size._0_4_ = (undefined4)local_68.size;
    iVar2 = QStringView::compare(&local_48,other_00,CaseInsensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    if (iVar2 == 0) {
      QXmlStreamReader::readElementText(&local_68,this_04,0);
      setElementExtends(this,(QString *)&local_68);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"header",6);
      other_01.m_data._4_4_ = local_68.ptr._4_4_;
      other_01.m_data._0_4_ = local_68.ptr._0_4_;
      other_01.m_size._4_4_ = local_68.size._4_4_;
      other_01.m_size._0_4_ = (undefined4)local_68.size;
      sVar3 = 0;
      iVar2 = QStringView::compare(&local_48,other_01,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      if (iVar2 == 0) {
        this_00 = (DomHeader *)operator_new(0x38);
        (this_00->m_text).d.d = (Data *)0x0;
        (this_00->m_text).d.ptr = (char16_t *)0x0;
        (this_00->m_text).d.size = 0;
        (this_00->m_attr_location).d.d = (Data *)0x0;
        (this_00->m_attr_location).d.ptr = (char16_t *)0x0;
        (this_00->m_attr_location).d.size = 0;
        *(undefined8 *)&this_00->m_has_attr_location = 0;
        DomHeader::read(this_00,__fd,__buf_00,sVar3);
        setElementHeader(this,this_00);
        goto LAB_001537ae;
      }
      Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"sizehint",8);
      other_02.m_data._4_4_ = local_68.ptr._4_4_;
      other_02.m_data._0_4_ = local_68.ptr._0_4_;
      other_02.m_size._4_4_ = local_68.size._4_4_;
      other_02.m_size._0_4_ = (undefined4)local_68.size;
      sVar3 = 0;
      iVar2 = QStringView::compare(&local_48,other_02,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      if (iVar2 == 0) {
        this_01 = (DomSize *)operator_new(0xc);
        this_01->m_children = 0;
        this_01->m_width = 0;
        this_01->m_height = 0;
        DomSize::read(this_01,__fd,__buf_01,sVar3);
        setElementSizeHint(this,this_01);
        goto LAB_001537ae;
      }
      Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"addpagemethod",0xd);
      other_03.m_data._4_4_ = local_68.ptr._4_4_;
      other_03.m_data._0_4_ = local_68.ptr._0_4_;
      other_03.m_size._4_4_ = local_68.size._4_4_;
      other_03.m_size._0_4_ = (undefined4)local_68.size;
      iVar2 = QStringView::compare(&local_48,other_03,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(&local_68,this_04,0);
        setElementAddPageMethod(this,(QString *)&local_68);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"container",9);
        other_04.m_data._4_4_ = local_68.ptr._4_4_;
        other_04.m_data._0_4_ = local_68.ptr._0_4_;
        other_04.m_size._4_4_ = local_68.size._4_4_;
        other_04.m_size._0_4_ = (undefined4)local_68.size;
        iVar2 = QStringView::compare(&local_48,other_04,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        if (iVar2 != 0) {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"sizepolicy",10);
          other_05.m_data._4_4_ = local_68.ptr._4_4_;
          other_05.m_data._0_4_ = local_68.ptr._0_4_;
          other_05.m_size._4_4_ = local_68.size._4_4_;
          other_05.m_size._0_4_ = (undefined4)local_68.size;
          iVar2 = QStringView::compare(&local_48,other_05,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          if (iVar2 == 0) {
            pcVar4 = "Omitting deprecated element <sizepolicy>.";
          }
          else {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"pixmap",6);
            other_06.m_data._4_4_ = local_68.ptr._4_4_;
            other_06.m_data._0_4_ = local_68.ptr._0_4_;
            other_06.m_size._4_4_ = local_68.size._4_4_;
            other_06.m_size._0_4_ = (undefined4)local_68.size;
            iVar2 = QStringView::compare(&local_48,other_06,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
            if (iVar2 == 0) {
              QXmlStreamReader::readElementText(&local_68,this_04,0);
              setElementPixmap(this,(QString *)&local_68);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
              goto LAB_001537ae;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"script",6);
            other_07.m_data._4_4_ = local_68.ptr._4_4_;
            other_07.m_data._0_4_ = local_68.ptr._0_4_;
            other_07.m_size._4_4_ = local_68.size._4_4_;
            other_07.m_size._0_4_ = (undefined4)local_68.size;
            iVar2 = QStringView::compare(&local_48,other_07,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
            if (iVar2 == 0) {
              local_68.d._0_4_ = 2;
              local_68.d._4_4_ = 0;
              local_68.ptr._0_4_ = 0;
              local_68.ptr._4_4_ = 0;
              local_68.size._0_4_ = 0;
              local_68.size._4_4_ = 0;
              local_50 = "default";
              QMessageLogger::warning((char *)&local_68,"Omitting deprecated element <script>.");
              QXmlStreamReader::skipCurrentElement();
              goto LAB_001537ae;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"properties",10);
            other_08.m_data._4_4_ = local_68.ptr._4_4_;
            other_08.m_data._0_4_ = local_68.ptr._0_4_;
            other_08.m_size._4_4_ = local_68.size._4_4_;
            other_08.m_size._0_4_ = (undefined4)local_68.size;
            iVar2 = QStringView::compare(&local_48,other_08,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
            if (iVar2 != 0) {
              Qt::Literals::StringLiterals::operator____s((QString *)&local_68,L"slots",5);
              other_09.m_data._4_4_ = local_68.ptr._4_4_;
              other_09.m_data._0_4_ = local_68.ptr._0_4_;
              other_09.m_size._4_4_ = local_68.size._4_4_;
              other_09.m_size._0_4_ = (undefined4)local_68.size;
              sVar3 = 0;
              iVar2 = QStringView::compare(&local_48,other_09,CaseInsensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
              if (iVar2 == 0) {
                this_02 = (DomSlots *)operator_new(0x38);
                *(undefined8 *)this_02 = 0;
                (this_02->m_signal).d.d = (Data *)0x0;
                (this_02->m_signal).d.ptr = (QString *)0x0;
                (this_02->m_signal).d.size = 0;
                (this_02->m_slot).d.d = (Data *)0x0;
                (this_02->m_slot).d.ptr = (QString *)0x0;
                (this_02->m_slot).d.size = 0;
                DomSlots::read(this_02,__fd,__buf_02,sVar3);
                setElementSlots(this,this_02);
              }
              else {
                Qt::Literals::StringLiterals::operator____s
                          ((QString *)&local_68,L"propertyspecifications",0x16);
                other_10.m_data._4_4_ = local_68.ptr._4_4_;
                other_10.m_data._0_4_ = local_68.ptr._0_4_;
                other_10.m_size._4_4_ = local_68.size._4_4_;
                other_10.m_size._0_4_ = (undefined4)local_68.size;
                sVar3 = 0;
                iVar2 = QStringView::compare(&local_48,other_10,CaseInsensitive);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
                if (iVar2 != 0) {
                  local_80.a.m_size = 0x13;
                  local_80.a.m_data = "Unexpected element ";
                  local_80.b = &local_48;
                  QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                            ((QString *)&local_68,&local_80);
                  QXmlStreamReader::raiseError((QString *)this_04);
                  goto LAB_00153b16;
                }
                this_03 = (DomPropertySpecifications *)operator_new(0x38);
                *(undefined8 *)this_03 = 0;
                (this_03->m_tooltip).d.d = (Data *)0x0;
                (this_03->m_tooltip).d.ptr = (DomPropertyToolTip **)0x0;
                (this_03->m_tooltip).d.size = 0;
                (this_03->m_stringpropertyspecification).d.d = (Data *)0x0;
                (this_03->m_stringpropertyspecification).d.ptr =
                     (DomStringPropertySpecification **)0x0;
                (this_03->m_stringpropertyspecification).d.size = 0;
                DomPropertySpecifications::read(this_03,__fd,__buf_03,sVar3);
                setElementPropertyspecifications(this,this_03);
              }
              goto LAB_001537ae;
            }
            pcVar4 = "Omitting deprecated element <properties>.";
          }
          local_50 = "default";
          local_68.size._4_4_ = 0;
          local_68.size._0_4_ = 0;
          local_68.ptr._4_4_ = 0;
          local_68.ptr._0_4_ = 0;
          local_68.d._4_4_ = 0;
          local_68.d._0_4_ = 2;
          QMessageLogger::warning((char *)&local_68,pcVar4);
          QXmlStreamReader::skipCurrentElement();
          goto LAB_001537ae;
        }
        QXmlStreamReader::readElementText(&local_68,this_04,0);
        iVar2 = QString::toInt((QString *)&local_68,(bool *)0x0,10);
        *(byte *)&this->m_children = (byte)this->m_children | 0x20;
        this->m_container = iVar2;
      }
    }
  }
LAB_00153b16:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  goto LAB_001537ae;
}

Assistant:

void DomCustomWidget::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                setElementClass(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"extends"_s, Qt::CaseInsensitive)) {
                setElementExtends(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"header"_s, Qt::CaseInsensitive)) {
                auto *v = new DomHeader();
                v->read(reader);
                setElementHeader(v);
                continue;
            }
            if (!tag.compare(u"sizehint"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSize();
                v->read(reader);
                setElementSizeHint(v);
                continue;
            }
            if (!tag.compare(u"addpagemethod"_s, Qt::CaseInsensitive)) {
                setElementAddPageMethod(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"container"_s, Qt::CaseInsensitive)) {
                setElementContainer(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"sizepolicy"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <sizepolicy>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"pixmap"_s, Qt::CaseInsensitive)) {
                setElementPixmap(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"script"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <script>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"properties"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <properties>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"slots"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSlots();
                v->read(reader);
                setElementSlots(v);
                continue;
            }
            if (!tag.compare(u"propertyspecifications"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPropertySpecifications();
                v->read(reader);
                setElementPropertyspecifications(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}